

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorManager.cpp
# Opt level: O3

unique_ptr<DetectorManager,_std::default_delete<DetectorManager>_> DetectorManager::create(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  *this;
  __uniq_ptr_data<DetectorManager,_std::default_delete<DetectorManager>,_true,_true> in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
  __l;
  DetectorMap_t detectors;
  allocator_type local_7a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_79;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  local_48;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0019cba0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__DetectorLauncherInterface_0019cc18;
  paVar1 = &local_78.first.field_2;
  local_78.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"yolact","");
  local_78.second.
  super___shared_ptr<DetectorManager::DetectorLauncherInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var2 + 1);
  __l._M_len = 1;
  __l._M_array = &local_78;
  local_78.second.
  super___shared_ptr<DetectorManager::DetectorLauncherInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
         *)&local_48,__l,&local_79,&local_7a);
  if (local_78.second.
      super___shared_ptr<DetectorManager::DetectorLauncherInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.second.
               super___shared_ptr<DetectorManager::DetectorLauncherInterface,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.first._M_dataplus._M_p,local_78.first.field_2._M_allocated_capacity + 1
                   );
  }
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
          *)operator_new(0x30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::_Rb_tree(this,&local_48);
  *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
    **)in_RDI.super___uniq_ptr_impl<DetectorManager,_std::default_delete<DetectorManager>_>._M_t.
       super__Tuple_impl<0UL,_DetectorManager_*,_std::default_delete<DetectorManager>_>.
       super__Head_base<0UL,_DetectorManager_*,_false>._M_head_impl = this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::~_Rb_tree(&local_48);
  return (__uniq_ptr_data<DetectorManager,_std::default_delete<DetectorManager>,_true,_true>)
         (tuple<DetectorManager_*,_std::default_delete<DetectorManager>_>)
         in_RDI.super___uniq_ptr_impl<DetectorManager,_std::default_delete<DetectorManager>_>._M_t.
         super__Tuple_impl<0UL,_DetectorManager_*,_std::default_delete<DetectorManager>_>.
         super__Head_base<0UL,_DetectorManager_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<DetectorManager> DetectorManager::create() 
{
	DetectorMap_t detectors = 
	{
		{"yolact", std::make_shared<DetectorLauncher<Yolact>>()},
	};

	auto mgt = new DetectorManager(detectors);
	if (!mgt) 
	{
		return nullptr;
	}

	return std::unique_ptr<DetectorManager>(std::move(mgt));
}